

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O0

bool __thiscall
optimization::global_expr_move::BlockOps::disable_op
          (BlockOps *this,
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          *op)

{
  char *pcVar1;
  size_type sVar2;
  int in_EDX;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *in_RSI;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *in_RDI;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> load;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *in_stack_ffffffffffffff88;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *__x;
  undefined1 local_1;
  
  __x = in_RSI;
  pcVar1 = std::
           variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
           ::index((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                    *)in_RSI,(char *)in_RSI,in_EDX);
  if (pcVar1 == (char *)0x0) {
    local_1 = false;
  }
  else {
    std::
    get<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
              ((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                *)0x1873a6);
    std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>::pair
              (in_RSI,in_stack_ffffffffffffff88);
    sVar2 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            count(in_RDI,(key_type *)__x);
    local_1 = sVar2 != 0;
  }
  return local_1;
}

Assistant:

bool disable_op(std::variant<Op, LoadOp> op) {
    if (op.index() == 0) {
      return false;
    } else {
      auto load = std::get<LoadOp>(op);
      return stores.count(load.first.first);
    }
  }